

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ExprList *pEVar1;
  SrcList *pSVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  ulong uVar5;
  Expr **ppEVar6;
  ulong uVar7;
  ulong uVar8;
  ExprList_item *pEVar9;
  ulong uVar10;
  long lVar11;
  
  uVar8 = 0;
  if (pS != (Select *)0x0) {
    do {
      pEVar1 = pS->pEList;
      pSVar2 = pS->pSrc;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar7 = 0;
      }
      else {
        pEVar9 = pEVar1->a;
        lVar11 = 0;
        uVar7 = 0;
        do {
          BVar3 = sqlite3WhereExprUsage(pMaskSet,pEVar9->pExpr);
          uVar7 = uVar7 | BVar3;
          lVar11 = lVar11 + 1;
          pEVar9 = pEVar9 + 1;
        } while (lVar11 < pEVar1->nExpr);
      }
      pEVar1 = pS->pGroupBy;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar5 = 0;
      }
      else {
        pEVar9 = pEVar1->a;
        lVar11 = 0;
        uVar5 = 0;
        do {
          BVar3 = sqlite3WhereExprUsage(pMaskSet,pEVar9->pExpr);
          uVar5 = uVar5 | BVar3;
          lVar11 = lVar11 + 1;
          pEVar9 = pEVar9 + 1;
        } while (lVar11 < pEVar1->nExpr);
      }
      pEVar1 = pS->pOrderBy;
      if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
        uVar10 = 0;
      }
      else {
        pEVar9 = pEVar1->a;
        lVar11 = 0;
        uVar10 = 0;
        do {
          BVar3 = sqlite3WhereExprUsage(pMaskSet,pEVar9->pExpr);
          uVar10 = uVar10 | BVar3;
          lVar11 = lVar11 + 1;
          pEVar9 = pEVar9 + 1;
        } while (lVar11 < pEVar1->nExpr);
      }
      BVar3 = sqlite3WhereExprUsage(pMaskSet,pS->pWhere);
      BVar4 = sqlite3WhereExprUsage(pMaskSet,pS->pHaving);
      uVar8 = uVar7 | uVar8 | uVar5 | BVar3 | uVar10 | BVar4;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        ppEVar6 = &pSVar2->a[0].pOn;
        lVar11 = 0;
        do {
          BVar3 = exprSelectUsage(pMaskSet,(Select *)ppEVar6[-4]);
          BVar4 = sqlite3WhereExprUsage(pMaskSet,*ppEVar6);
          uVar8 = BVar3 | uVar8 | BVar4;
          lVar11 = lVar11 + 1;
          ppEVar6 = ppEVar6 + 0xe;
        } while (lVar11 < pSVar2->nSrc);
      }
      pS = pS->pPrior;
    } while (pS != (Select *)0x0);
  }
  return uVar8;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].pOn);
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}